

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PushUnaryMinus.cpp
# Opt level: O3

TermList Inferences::pushUMinus(UMinus outerMinus,TermList t)

{
  ulong uVar1;
  bool bVar2;
  Interpretation IVar3;
  uint uVar4;
  uint uVar5;
  TermList TVar6;
  TermList TVar7;
  int iVar8;
  ulong uVar9;
  uint n;
  uint n_00;
  Stack<Kernel::TermList> out;
  Stack<Kernel::TermList> local_58;
  
  uVar9 = (ulong)outerMinus;
  uVar1 = t._content & 1;
  while( true ) {
    if (uVar1 != 0) {
      TVar6._content = (*(code *)(&DAT_008f4234 + *(int *)(&DAT_008f4234 + uVar9 * 4)))();
      return (TermList)TVar6._content;
    }
    if ((((Term *)t._content)->_args[0]._content & 0x20) != 0) {
      return (TermList)t._content;
    }
    uVar4 = ((Term *)t._content)->_functor;
    bVar2 = Kernel::Theory::isInterpretedFunction((Theory *)Kernel::theory,uVar4);
    iVar8 = (int)uVar9;
    if (!bVar2) break;
    IVar3 = Kernel::Theory::interpretFunction((Theory *)Kernel::theory,uVar4);
    if ((int)IVar3 < 0x28) {
      if (IVar3 == INT_UNARY_MINUS) {
        uVar9 = 0;
      }
      else {
        if (IVar3 != RAT_UNARY_MINUS) {
          if ((IVar3 == INT_PLUS) && (iVar8 != 3)) {
            TVar6 = Kernel::Term::termArg(t._content,0);
            TVar6 = pushUMinus(Int,TVar6);
            TVar7 = Kernel::Term::termArg(t._content,1);
            TVar7 = pushUMinus(Int,TVar7);
            TVar6 = Kernel::NumTraits<Kernel::IntegerConstantType>::add(TVar6,TVar7);
            return (TermList)TVar6._content;
          }
          break;
        }
        uVar9 = 1;
      }
    }
    else {
      if (IVar3 != REAL_UNARY_MINUS) {
        if (IVar3 == RAT_PLUS) {
          if (iVar8 != 3) {
            TVar6 = Kernel::Term::termArg(t._content,0);
            TVar6 = pushUMinus(Rat,TVar6);
            TVar7 = Kernel::Term::termArg(t._content,1);
            TVar7 = pushUMinus(Rat,TVar7);
            TVar6 = Kernel::NumTraits<Kernel::RationalConstantType>::add(TVar6,TVar7);
            return (TermList)TVar6._content;
          }
        }
        else if ((IVar3 == REAL_PLUS) && (iVar8 != 3)) {
          TVar6 = Kernel::Term::termArg(t._content,0);
          TVar6 = pushUMinus(Real,TVar6);
          TVar7 = Kernel::Term::termArg(t._content,1);
          TVar7 = pushUMinus(Real,TVar7);
          TVar6 = Kernel::NumTraits<Kernel::RealConstantType>::add(TVar6,TVar7);
          return (TermList)TVar6._content;
        }
        break;
      }
      uVar9 = 2;
    }
    if (iVar8 != 3) {
      TVar6 = Kernel::Term::termArg(t._content,0);
      return (TermList)TVar6._content;
    }
    t = Kernel::Term::termArg(t._content,0);
    uVar1 = t._content & 1;
  }
  uVar4 = Kernel::Term::numTypeArguments((Term *)t._content);
  uVar5 = Kernel::Term::numTermArguments((Term *)t._content);
  local_58._capacity = 0;
  local_58._stack = (TermList *)0x0;
  local_58._cursor = (TermList *)0x0;
  local_58._end = (TermList *)0x0;
  bVar2 = true;
  n_00 = 0;
  n = 0;
  do {
    if (bVar2) {
      if (uVar4 <= n_00) {
        bVar2 = false;
        goto LAB_005085ea;
      }
    }
    else {
LAB_005085ea:
      if (uVar5 <= n) {
        Kernel::Term::create((Term *)t._content,local_58._stack);
        TVar6._content = (*(code *)(&DAT_008f4244 + *(int *)(&DAT_008f4244 + uVar9 * 4)))();
        return (TermList)TVar6._content;
      }
    }
    if ((bVar2) && (uVar4 <= n_00)) {
      bVar2 = false;
    }
    if (bVar2) {
      TVar6 = Kernel::Term::typeArg(t._content,n_00);
      n_00 = n_00 + 1;
    }
    else {
      TVar6 = Kernel::Term::termArg(t._content,n);
      TVar6 = pushUMinus(None,TVar6);
      n = n + 1;
    }
    if (local_58._cursor == local_58._end) {
      Lib::Stack<Kernel::TermList>::expand(&local_58);
    }
    (local_58._cursor)->_content = TVar6._content;
    local_58._cursor = local_58._cursor + 1;
  } while( true );
}

Assistant:

TermList pushUMinus(UMinus outerMinus, TermList t) 
{
  auto wrapMinus = [&](TermList t) 
  {
    switch (outerMinus) {
      case UMinus::Int : return IntTraits::minus(t);
      case UMinus::Rat : return RatTraits::minus(t);
      case UMinus::Real: return RealTraits::minus(t);
      case UMinus::None: return t;
      default:
        ASSERTION_VIOLATION;
    }
    ASSERTION_VIOLATION
  };

  if (t.isVar()) {
    return wrapMinus(t);
  } else if(t.term()->isSort()){
    return t;
  } else {
    auto term = t.term();
auto fun = term->functor();
    if (theory->isInterpretedFunction(fun)) {
      switch (theory->interpretFunction(fun)) {
#define CASE(Num)                                                                                             \
        case Num##Traits::minusI:                                                                             \
        {                                                                                                     \
          if(outerMinus == UMinus::None) {                                                                    \
            return pushUMinus(UMinus::Num, term->termArg(0));                                                 \
          } else {                                                                                            \
            ASS_EQ(outerMinus, UMinus::Num)                                                                   \
            return term->termArg(0);                                                                          \
          }                                                                                                   \
        }                                                                                                     \
        case Num##Traits::addI:                                                                               \
        if (outerMinus != UMinus::None) {                                                                     \
          ASS_EQ(outerMinus, UMinus::Num);                                                                    \
          return Num##Traits::add(                                                                            \
              pushUMinus(UMinus::Num, term->termArg(0)),                                                      \
              pushUMinus(UMinus::Num, term->termArg(1)));                                                     \
        } else { break; }
        CASE(Int)
        CASE(Rat)
        CASE(Real)
        default: {}
      }
    }
    auto args = concatIters(
        typeArgIter(term),
        termArgIter(term)
          .map([&](auto t) { return pushUMinus(UMinus::None, t); }))
      .template collect<Stack>();

    return wrapMinus(TermList(Term::create(term, args.begin())));
  }
}
PushUnaryMinus::~PushUnaryMinus() {}

Clause* PushUnaryMinus::simplify(Clause* cl_) 
{
  DEBUG("in:  ", *cl_)
  if (cl_->isTheoryAxiom()) 
    return cl_;

  auto& cl = *cl_;
  Stack<Literal*> out(cl.size());

  bool changed = false;

  for (unsigned i = 0; i < cl.size(); i++) {
    auto litIn = cl[i];
    auto litStack = concatIters(
        typeArgIter(litIn),
        termArgIter(litIn)
          .map([&](auto tIn) {
            auto tOut = pushUMinus(UMinus::None, tIn);
            changed = changed || tIn != tOut;
            return tOut;
          })
        ).template collect<Stack>();
    if(changed){
      auto litOut = Literal::create(litIn, litStack.begin());
      out.push(litOut);
    } else {
      out.push(litIn);
    }
  }

  if (!changed) {
    return cl_;
  } else {
    auto result = Clause::fromStack(out, SimplifyingInference1(InferenceRule::EVALUATION, cl_));
    DEBUG("out: ", *result)
    return result;
  }
}


}